

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O3

void __thiscall ReadGroupResolver::ReadGroupResolver(ReadGroupResolver *this)

{
  _Rb_tree_header *p_Var1;
  uint16_t id;
  ModelType local_40;
  
  this->MinFragmentLength = 0;
  this->MedianFragmentLength = 0;
  this->MaxFragmentLength = 0;
  this->TopModelId = 100;
  this->NextTopModelId = 100;
  this->IsAmbiguous = false;
  this->HasData = false;
  (this->Models).super__Vector_base<ModelType,_std::allocator<ModelType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Models).super__Vector_base<ModelType,_std::allocator<ModelType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Models).super__Vector_base<ModelType,_std::allocator<ModelType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->ReadNames)._M_t._M_impl.super__Rb_tree_header;
  (this->ReadNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ReadNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ReadNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ReadNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ReadNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<ModelType,_std::allocator<ModelType>_>::reserve(&this->Models,8);
  id = 1;
  do {
    ModelType::ModelType(&local_40,id);
    std::vector<ModelType,_std::allocator<ModelType>_>::emplace_back<ModelType>
              (&this->Models,&local_40);
    if (local_40.FragmentLengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.FragmentLengths.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    id = id + 1;
  } while (id != 9);
  return;
}

Assistant:

ReadGroupResolver::ReadGroupResolver()
    : MinFragmentLength(0)
    , MedianFragmentLength(0)
    , MaxFragmentLength(0)
    , TopModelId(ModelType::DUMMY_ID)
    , NextTopModelId(ModelType::DUMMY_ID)
    , IsAmbiguous(false)
    , HasData(false)
{
    // pre-allocate space for 8 models
    Models.reserve(NUM_MODELS);
    for (uint16_t i = 0; i < NUM_MODELS; ++i)
        Models.push_back(ModelType(i + 1));
}